

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interrupts.c
# Opt level: O0

void check_interrupt(interrupt_queues *interrupt,uint64_t diff,uint32_t buf_index,uint32_t buf_size)

{
  uint *puVar1;
  uint64_t uVar2;
  int in_ECX;
  int in_EDX;
  uint64_t in_RSI;
  long in_RDI;
  uint64_t average;
  interrupt_moving_avg *avg;
  
  puVar1 = (uint *)(in_RDI + 0x30);
  *(long *)(in_RDI + 0x38) =
       *(long *)(in_RDI + 0x38) - *(long *)(in_RDI + 0x40 + (ulong)*puVar1 * 8);
  uVar2 = ppms(*(uint64_t *)(in_RDI + 0x20),in_RSI);
  *(uint64_t *)(in_RDI + 0x40 + (ulong)*puVar1 * 8) = uVar2;
  *(long *)(in_RDI + 0x38) =
       *(long *)(in_RDI + 0x40 + (ulong)*puVar1 * 8) + *(long *)(in_RDI + 0x38);
  if (*(uint *)(in_RDI + 0x34) < 5) {
    *(int *)(in_RDI + 0x34) = *(int *)(in_RDI + 0x34) + 1;
  }
  *puVar1 = (*puVar1 + 1) % 5;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  if (*(ulong *)(in_RDI + 0x38) / (ulong)*(uint *)(in_RDI + 0x34) < 0x4b1) {
    if (in_EDX == in_ECX) {
      *(undefined1 *)(in_RDI + 8) = 0;
    }
    else {
      *(undefined1 *)(in_RDI + 8) = 1;
    }
  }
  else {
    *(undefined1 *)(in_RDI + 8) = 0;
  }
  uVar2 = monotonic_time();
  *(uint64_t *)(in_RDI + 0x10) = uVar2;
  return;
}

Assistant:

void check_interrupt(struct interrupt_queues* interrupt, uint64_t diff, uint32_t buf_index, uint32_t buf_size) {
	struct interrupt_moving_avg* avg = &interrupt->moving_avg;
	avg->sum -= avg->measured_rates[avg->index];
	avg->measured_rates[avg->index] = ppms(interrupt->rx_pkts, diff);
	avg->sum += avg->measured_rates[avg->index];
	if (avg->length < MOVING_AVERAGE_RANGE) {
		avg->length++;
	}
	avg->index = (avg->index + 1) % MOVING_AVERAGE_RANGE;
	interrupt->rx_pkts = 0;
	uint64_t average = avg->sum / avg->length;
	if (average > INTERRUPT_THRESHOLD) {
		interrupt->interrupt_enabled = false;
	} else if (buf_index == buf_size) {
		interrupt->interrupt_enabled = false;
	} else {
		interrupt->interrupt_enabled = true;
	}
	interrupt->last_time_checked = monotonic_time();
}